

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall MobileElementManager::UpdatePropensity(MobileElementManager *this,int index)

{
  int iVar1;
  _Base_ptr p_Var2;
  pointer pdVar3;
  bool bVar4;
  SpeciesTracker *pSVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  runtime_error *this_00;
  _Base_ptr __lhs;
  double local_88;
  shared_ptr<MobileElement> pol;
  string codon;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GetPol((MobileElementManager *)&pol,(int)this);
  iVar1 = (pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->stop_;
  pSVar5 = SpeciesTracker::Instance();
  bVar4 = std::operator==(&(pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->name_,"__ribosome");
  if ((bVar4) && ((pSVar5->codon_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    if ((iVar1 < 0) || ((this->seq_)._M_string_length <= (ulong)(long)iVar1)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Genome sequence not correct size.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::substr((ulong)&codon,(ulong)&this->seq_);
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::find(&(pSVar5->codon_map_)._M_t,&codon);
    __lhs = *(_Base_ptr *)(cVar6._M_node + 2);
    p_Var2 = cVar6._M_node[2]._M_parent;
    local_88 = 0.0;
    for (; __lhs != p_Var2; __lhs = __lhs + 1) {
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     "_charged");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&(pSVar5->species_)._M_t,&local_50);
      local_88 = local_88 + (double)(int)cVar7._M_node[2]._M_color;
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&codon);
  }
  else {
    bVar4 = std::operator==(&(pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->name_,"__ribosome");
    local_88 = 1.0;
    if ((bVar4) &&
       (pdVar3 = (this->weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
       pdVar3 != (this->weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish)) {
      local_88 = pdVar3[(long)(pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->stop_ + -1] + 0.0;
    }
  }
  local_88 = local_88 *
             (pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->speed_;
  pdVar3 = (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->prop_sum_ = (local_88 - pdVar3[index]) + this->prop_sum_;
  pdVar3[index] = local_88;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void MobileElementManager::UpdatePropensity(int index) {
  auto pol = GetPol(index);
  int position_index = pol->stop();
  auto &tracker = SpeciesTracker::Instance();
  double weight = 1; 
  if (pol->name() == "__ribosome" && !tracker.codon_map().empty()) {
    if (position_index >= seq_.size() || position_index < 0) {
      throw std::runtime_error("Genome sequence not correct size.");
    }
    weight--;
    std::string codon = seq_.substr(pol->stop(), 3);
    //std::cout << codon << std::endl;
    // std::vector<std::string> stop_codons = {"TAG", "TAA", "TGA"};
    // check if occupied codon is a stop codon
    // if (std::find(stop_codons.begin(), stop_codons.end(), codon) == stop_codons.end()) {
    auto anticodons = tracker.codon_map().find(codon);
    for (auto const& anticodon : anticodons->second) {
      // std::cout << anticodon << std::endl;
      weight += tracker.species().find(anticodon + "_charged")->second;
    }
  } else if (pol->name() == "__ribosome" && !weights_.empty()) {
      weight--;
      weight += weights_[pol->stop() - 1];
  }
  double new_speed = weight * pol->speed();
  double diff = new_speed - prop_list_[index];
  prop_sum_ += diff;
  prop_list_[index] = new_speed;
}